

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_3::generateRandomInputData
               (Random *rnd,ShaderType shaderType,DataType dataType,Precision precision,
               deUint32 *dst,int numValues)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  iVar8 = (int)dst;
  uVar1 = glu::getDataTypeScalarSize(shaderType);
  bVar4 = (char)*(undefined4 *)(&DAT_01c9f770 + (ulong)dataType * 4) - 1;
  uVar10 = (2 << (bVar4 & 0x1f)) - 1;
  if (shaderType - 0x1f < 4) {
    if (0 < iVar8) {
      iVar5 = 0;
      iVar9 = 0;
      do {
        uVar6 = (ulong)uVar1;
        iVar7 = iVar5;
        if (0 < (int)uVar1) {
          do {
            dVar2 = deRandom_getUint32(&rnd->m_rnd);
            *(deUint32 *)(CONCAT44(in_register_0000000c,precision) + (long)iVar7 * 4) =
                 dVar2 & uVar10;
            iVar7 = iVar7 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        iVar9 = iVar9 + 1;
        iVar5 = iVar5 + uVar1;
      } while (iVar9 != iVar8);
    }
  }
  else if (0 < iVar8) {
    iVar5 = 0;
    iVar9 = 0;
    do {
      uVar6 = (ulong)uVar1;
      iVar7 = iVar5;
      if (0 < (int)uVar1) {
        do {
          dVar2 = deRandom_getUint32(&rnd->m_rnd);
          uVar3 = dVar2 & uVar10;
          *(uint *)(CONCAT44(in_register_0000000c,precision) + (long)iVar7 * 4) =
               (uVar3 & 1 << (bVar4 & 0x1f)) * -2 | uVar3;
          iVar7 = iVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      iVar9 = iVar9 + 1;
      iVar5 = iVar5 + uVar1;
    } while (iVar9 != iVar8);
  }
  return;
}

Assistant:

static void generateRandomInputData (de::Random& rnd, glu::ShaderType shaderType, glu::DataType dataType, glu::Precision precision, deUint32* dst, int numValues)
{
	const int				scalarSize		= glu::getDataTypeScalarSize(dataType);
	const deUint32			integerLength	= (deUint32)getShaderUintBitCount(shaderType, precision);
	const deUint32			integerMask		= getLowBitMask(integerLength);
	const bool				isUnsigned		= glu::isDataTypeUintOrUVec(dataType);

	if (isUnsigned)
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = rnd.getUint32() & integerMask;
	}
	else
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = extendSignTo32(rnd.getUint32() & integerMask, integerLength);
	}
}